

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.c
# Opt level: O2

rt_function_error_t exec_deconvolution(rt_function_t *f)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  uint *puVar5;
  void *__s;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int *piVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  int k;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  bool bVar26;
  rt_list_t shape;
  rt_list_t shape_00;
  rt_list_t shape_01;
  rt_list_t shape_02;
  rt_list_t out;
  rt_list_t out_00;
  rt_list_t shape_03;
  rt_list_t shape_04;
  rt_list_t shape_05;
  rt_list_t pos;
  float local_7c;
  
  plVar3 = (long *)f->local_context;
  plVar4 = (long *)*plVar3;
  shape._4_4_ = 0;
  shape.size = *(uint *)(plVar4 + 0xb);
  shape.data = (int *)plVar4[0xc];
  uVar6 = calc_shape_size(shape);
  shape_00._4_4_ = 0;
  shape_00.size = *(uint *)(plVar4 + 0xd);
  shape_00.data = (int *)plVar4[0xe];
  uVar7 = calc_shape_size(shape_00);
  shape_01._4_4_ = 0;
  shape_01.size = *(uint *)(plVar4 + 9);
  shape_01.data = (int *)plVar4[10];
  iVar8 = calc_shape_size(shape_01);
  puVar5 = (uint *)plVar4[6];
  __s = *(void **)(puVar5 + 6);
  shape_02._4_4_ = 0;
  shape_02.size = *puVar5;
  shape_02.data = *(int **)(puVar5 + 2);
  iVar9 = calc_shape_size(shape_02);
  iVar25 = 0;
  memset(__s,0,(long)iVar9 << 2);
  uVar24 = 0;
  if (0 < (int)uVar7) {
    uVar24 = (ulong)uVar7;
  }
  uVar12 = 0;
  if (0 < (int)uVar6) {
    uVar12 = (ulong)uVar6;
  }
  do {
    if (*(int *)((long)plVar4 + 0x9c) <= iVar25) {
      return RT_FUNCTION_ERROR_NOERROR;
    }
    iVar9 = (int)plVar3[8];
    iVar16 = iVar9;
    for (iVar14 = 0; iVar14 < iVar16; iVar14 = iVar14 + 1) {
      piVar19 = *(int **)(plVar4[2] + 8);
      for (lVar22 = 0; lVar22 < piVar19[1]; lVar22 = lVar22 + 1) {
        iVar17 = (iVar16 * iVar25 + iVar14) * piVar19[1];
        iVar16 = (int)lVar22;
        for (iVar20 = 0; iVar1 = *piVar19, iVar20 < iVar1 / iVar9; iVar20 = iVar20 + 1) {
          iVar2 = piVar19[1];
          for (uVar21 = 0; uVar21 != uVar12; uVar21 = uVar21 + 1) {
            out._4_4_ = 0;
            out.size = *(uint *)(plVar4 + 0x11);
            shape_04._4_4_ = 0;
            shape_04.size = *(uint *)(plVar4 + 0xb);
            out.data = (int *)plVar4[0x12];
            shape_04.data = (int *)plVar4[0xc];
            pos_to_shape(out,shape_04,(int)uVar21);
            local_7c = 0.0;
            for (uVar23 = 0; uVar23 != uVar24; uVar23 = uVar23 + 1) {
              out_00._4_4_ = 0;
              out_00.size = *(uint *)(plVar4 + 0xf);
              shape_05._4_4_ = 0;
              shape_05.size = *(uint *)(plVar4 + 0xd);
              out_00.data = (int *)plVar4[0x10];
              shape_05.data = (int *)plVar4[0xe];
              pos_to_shape(out_00,shape_05,(uint)uVar23);
              lVar13 = 0;
              while (lVar13 < (int)plVar4[0x13]) {
                iVar11 = *(int *)(plVar3[7] + lVar13 * 4);
                lVar15 = plVar4[0x10];
                iVar10 = *(int *)(plVar4[0xe] + lVar13 * 4);
                iVar18 = iVar11 * *(int *)(lVar15 + lVar13 * 4);
                *(int *)(lVar15 + lVar13 * 4) = iVar18;
                iVar18 = (*(int *)(plVar3[3] + lVar13 * 4) - (iVar10 + -1) * iVar11) + iVar18;
                *(int *)(lVar15 + lVar13 * 4) = iVar18;
                iVar18 = iVar18 + *(int *)(plVar4[0x12] + lVar13 * 4);
                *(int *)(lVar15 + lVar13 * 4) = iVar18;
                iVar11 = *(int *)(plVar3[5] + lVar13 * 4);
                iVar10 = iVar18 / iVar11;
                if (((iVar18 % iVar11 != 0) || (*(int *)(lVar15 + lVar13 * 4) = iVar10, iVar10 < 0))
                   || (lVar15 = lVar13 * 4, lVar13 = lVar13 + 1,
                      *(int *)(plVar4[10] + lVar15) <= iVar10)) goto LAB_0011b98c;
              }
              lVar13 = *(long *)(*plVar4 + 0x18);
              shape_03._4_4_ = 0;
              shape_03.size = *(uint *)(plVar4 + 9);
              pos._4_4_ = 0;
              pos.size = *(uint *)(plVar4 + 0xf);
              shape_03.data = (int *)plVar4[10];
              pos.data = (int *)plVar4[0x10];
              iVar11 = shape_to_pos(shape_03,pos);
              local_7c = local_7c +
                         *(float *)(lVar13 + (long)((iVar1 * iVar25 + iVar20 +
                                                    (iVar1 * iVar14) / iVar9) * iVar8) * 4 +
                                   (long)iVar11 * 4) *
                         *(float *)(*(long *)(plVar4[2] + 0x18) +
                                    (long)(int)((iVar2 * iVar20 + iVar16 +
                                                (iVar1 * iVar14 * iVar2) / iVar9) * uVar7) * 4 +
                                   (long)(int)(~(uint)uVar23 + uVar7) * 4);
LAB_0011b98c:
            }
            lVar13 = *(long *)(plVar4[6] + 0x18) + (long)(int)((iVar17 + iVar16) * uVar6) * 4;
            *(float *)(lVar13 + uVar21 * 4) = local_7c + *(float *)(lVar13 + uVar21 * 4);
          }
          iVar9 = (int)plVar3[8];
          piVar19 = *(int **)(plVar4[2] + 8);
        }
        lVar13 = plVar4[4];
        if (lVar13 != 0) {
          lVar15 = (long)(int)((iVar17 + iVar16) * uVar6) << 2;
          uVar21 = uVar12;
          while (bVar26 = uVar21 != 0, uVar21 = uVar21 - 1, bVar26) {
            *(float *)(*(long *)(plVar4[6] + 0x18) + lVar15) =
                 *(float *)((long)iVar14 * (long)piVar19[1] * 4 + *(long *)(lVar13 + 0x18) +
                           lVar22 * 4) + *(float *)(*(long *)(plVar4[6] + 0x18) + lVar15);
            lVar15 = lVar15 + 4;
          }
        }
        iVar16 = iVar9;
      }
    }
    iVar25 = iVar25 + 1;
  } while( true );
}

Assistant:

rt_function_error_t exec_deconvolution(rt_function_t *f) {
  deconvolution_local_context_t *c =
      (deconvolution_local_context_t *)(f->local_context);
  deconvolution_private_t *p = (deconvolution_private_t *)(c->data);

  int output_size = calc_shape_size(p->output_shape);
  int kernel_size = calc_shape_size(p->kernel_shape);
  int input_size = calc_shape_size(p->input_shape);

  memset(p->output->data, 0, sizeof(float) * calc_shape_size(p->output->shape));

  for (int b = 0; b < p->base_loop_size; b++) {
    for (int g = 0; g < c->group; g++) {
      for (int om = 0; om < p->weight->shape.data[1]; om++) {
        int output_offset = (b * c->group * p->weight->shape.data[1] +
                             g * p->weight->shape.data[1] + om) *
                            output_size;
        for (int im = 0; im < p->weight->shape.data[0] / c->group; im++) {
          int input_offset = (b * p->weight->shape.data[0] +
                              g * p->weight->shape.data[0] / c->group + im) *
                             input_size;
          int kernel_offset = (g * p->weight->shape.data[1] *
                                   p->weight->shape.data[0] / c->group +
                               im * p->weight->shape.data[1] + om) *
                              kernel_size;
          for (int o = 0; o < output_size; o++) {
            float sum = 0.0f;
            pos_to_shape(p->out_position, p->output_shape, o);
            for (int k = 0; k < kernel_size; k++) {
              pos_to_shape(p->in_position, p->kernel_shape, k);
              uint8_t condition = 1;
              for (int j = 0; j < p->spatial_dims; j++) {
                int k1 =
                    c->dilation.data[j] * (p->kernel_shape.data[j] - 1) + 1;
                p->in_position.data[j] *= c->dilation.data[j];
                p->in_position.data[j] -= k1 - c->pad.data[j] - 1;
                p->in_position.data[j] += p->out_position.data[j];
                if (p->in_position.data[j] % c->stride.data[j] != 0) {
                  condition = 0;
                  break;
                }
                p->in_position.data[j] =
                    p->in_position.data[j] / c->stride.data[j];
                if (p->in_position.data[j] < 0 ||
                    p->in_position.data[j] >= p->input_shape.data[j]) {
                  condition = 0;
                  break;
                }
              }
              if (condition) {
                float x = *((float *)(p->input->data) + input_offset +
                            shape_to_pos(p->input_shape, p->in_position));
                float w = *((float *)(p->weight->data) + kernel_offset +
                            (kernel_size - k - 1));
                sum += x * w;
              }
            }
            *((float *)(p->output->data) + output_offset + o) += sum;
          }
        }
        if (p->bias) {
          for (int o = 0; o < output_size; o++) {
            *((float *)(p->output->data) + output_offset + o) +=
                *((float *)(p->bias->data) + g * p->weight->shape.data[1] + om);
          }
        }
      }
    }
  }

  return RT_FUNCTION_ERROR_NOERROR;
}